

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_art.hpp
# Opt level: O1

bool __thiscall
unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::
try_prior(iterator *this)

{
  atomic<long> *paVar1;
  long *plVar2;
  long lVar3;
  ulong uVar4;
  version_type locked_version;
  version_tag_type vVar5;
  undefined1 uVar6;
  bool bVar7;
  stack_entry *psVar8;
  node_ptr node;
  byte unaff_R12B;
  basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
  *this_00;
  node_type type;
  char cVar9;
  undefined1 local_60 [8];
  iter_result_opt nxt;
  read_critical_section node_critical_section;
  
  do {
    if ((this->stack_).c.
        super__Deque_base<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        (this->stack_).c.
        super__Deque_base<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
        ._M_impl.super__Deque_impl_data._M_start._M_cur) {
      return true;
    }
    psVar8 = top(this);
    uVar4 = (psVar8->super_iter_result).node.tagged_ptr;
    if (uVar4 == 0) {
      __assert_fail("node != nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                    ,0x8aa,
                    "bool unodb::olc_db<unsigned long, std::span<const std::byte>>::iterator::try_prior() [Key = unsigned long, Value = std::span<const std::byte>]"
                   );
    }
    this_00 = (basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
               *)(uVar4 & 0xfffffffffffffff8);
    locked_version.version = psVar8->version;
    LOCK();
    paVar1 = &(this_00->super_header_type).m_lock.read_lock_count;
    (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
    UNLOCK();
    nxt.super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
    ._M_payload.
    super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>._24_8_
         = this_00;
    bVar7 = optimistic_lock::check((optimistic_lock *)this_00,locked_version);
    if (bVar7) {
      type = (node_type)uVar4 & (I256|I48);
      if ((uVar4 & 7) != 0) {
        detail::
        basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
        ::prior((iter_result_opt *)local_60,this_00,type,(psVar8->super_iter_result).child_index);
        bVar7 = optimistic_lock::check
                          ((optimistic_lock *)
                           nxt.
                           super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
                           ._M_payload.
                           super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
                           ._24_8_,locked_version);
        uVar6 = nxt.
                super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
                ._M_payload.
                super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
                ._M_payload._16_1_;
        if (!bVar7) goto LAB_0018aefd;
        pop(this);
        if (uVar6 == '\0') goto LAB_0018aea6;
        bVar7 = try_push(this,(iter_result *)local_60,
                         (read_critical_section *)
                         &nxt.
                          super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
                          ._M_payload.
                          super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
                          ._M_engaged);
        cVar9 = '\x01';
        if (bVar7) {
          node = detail::
                 basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                 ::get_child(this_00,type,
                             nxt.
                             super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
                             ._M_payload.
                             super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
                             ._M_payload._M_value.node.tagged_ptr._1_1_);
          bVar7 = optimistic_lock::check
                            ((optimistic_lock *)
                             nxt.
                             super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
                             ._M_payload.
                             super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
                             ._24_8_,locked_version);
          if (bVar7) {
            unaff_R12B = try_right_most_traversal
                                   (this,(olc_node_ptr)node.tagged_ptr,
                                    (read_critical_section *)
                                    &nxt.
                                     super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
                                     ._M_payload.
                                     super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
                                     ._M_engaged);
            goto LAB_0018aee8;
          }
          nxt.
          super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
          ._M_payload.
          super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>.
          _M_engaged = false;
          nxt.
          super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
          ._M_payload.
          super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>.
          _25_7_ = 0;
        }
        goto LAB_0018af0b;
      }
      pop(this);
LAB_0018aea6:
      if (*(long *)(nxt.
                    super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
                    ._M_payload.
                    super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
                    ._24_8_ + 8) < 1) {
        __assert_fail("read_lock_count.load(std::memory_order_acquire) > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                      ,0x2f6,"bool unodb::optimistic_lock::check(version_type) const");
      }
      vVar5 = *(version_tag_type *)
               nxt.
               super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
               ._M_payload.
               super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
               ._24_8_;
      if (locked_version.version == vVar5) {
LAB_0018aec3:
        LOCK();
        plVar2 = (long *)(nxt.
                          super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
                          ._M_payload.
                          super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
                          ._24_8_ + 8);
        lVar3 = *plVar2;
        *plVar2 = *plVar2 + -1;
        UNLOCK();
        if (SBORROW8(lVar3,1) != *plVar2 < 0) {
LAB_0018af5c:
          __assert_fail("old_value > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                        ,0x343,"void unodb::optimistic_lock::dec_read_lock_count() const");
        }
      }
      else {
        LOCK();
        plVar2 = (long *)(nxt.
                          super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
                          ._M_payload.
                          super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
                          ._24_8_ + 8);
        lVar3 = *plVar2;
        *plVar2 = *plVar2 + -1;
        UNLOCK();
        if (SBORROW8(lVar3,1) != *plVar2 < 0) goto LAB_0018af5c;
        if (locked_version.version == vVar5) goto LAB_0018aec3;
      }
      nxt.
      super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>.
      _M_payload.
      super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>.
      _M_engaged = false;
      nxt.
      super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>.
      _M_payload.
      super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>.
      _25_7_ = 0;
      cVar9 = (locked_version.version == vVar5) + '\x01';
      unaff_R12B = locked_version.version == vVar5 & unaff_R12B;
    }
    else {
LAB_0018aefd:
      nxt.
      super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>.
      _M_payload.
      super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>.
      _M_engaged = false;
      nxt.
      super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>.
      _M_payload.
      super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>.
      _25_7_ = 0;
LAB_0018af0b:
      cVar9 = '\x01';
      unaff_R12B = false;
    }
LAB_0018aee8:
    optimistic_lock::read_critical_section::~read_critical_section
              ((read_critical_section *)
               &nxt.
                super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
                ._M_payload.
                super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
                ._M_engaged);
    if (cVar9 == '\x01') {
      return (bool)unaff_R12B;
    }
  } while( true );
}

Assistant:

bool olc_db<Key, Value>::iterator::try_prior() {
  while (!empty()) {
    const auto& e = top();
    const auto node{e.node};  // the node on the top of the stack.
    UNODB_DETAIL_ASSERT(node != nullptr);
    auto node_critical_section(
        node_ptr_lock(node).rehydrate_read_lock(e.version));
    if (UNODB_DETAIL_UNLIKELY(!node_critical_section.check()))
      return false;  // LCOV_EXCL_LINE
    const auto node_type = node.type();
    if (node_type == node_type::LEAF) {
      pop();  // pop off the leaf
      if (UNODB_DETAIL_UNLIKELY(!node_critical_section.try_read_unlock()))
        return false;  // LCOV_EXCL_LINE
      continue;  // falls through loop if just a root leaf since stack now empty
    }
    auto* inode{node.template ptr<inode_type*>()};
    auto nxt = inode->prior(node_type, e.child_index);  // prev child of parent
    if (UNODB_DETAIL_UNLIKELY(!node_critical_section.check()))
      return false;  // LCOV_EXCL_LINE
    if (!nxt) {
      pop();  // Nothing more for that inode.
      if (UNODB_DETAIL_UNLIKELY(!node_critical_section.try_read_unlock()))
        return false;  // LCOV_EXCL_LINE
      continue;        // We will look for the left sibling of the parent inode.
    }
    // Fix up stack for new parent node state and right-most descent.
    UNODB_DETAIL_ASSERT(nxt);  // value exists for std::optional.
    const auto& e2 = nxt.value();
    pop();
    if (UNODB_DETAIL_UNLIKELY(!try_push(e2, node_critical_section)))
      return false;                                            // LCOV_EXCL_LINE
    auto child = inode->get_child(node_type, e2.child_index);  // get child
    if (UNODB_DETAIL_UNLIKELY(!node_critical_section.check()))  // before using
      return false;  // LCOV_EXCL_LINE
    return try_right_most_traversal(child, node_critical_section);
  }
  return true;  // stack is empty, so iterator == end().
}